

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_4c0ed::DepsLogTestWriteRead::Run(DepsLogTestWriteRead *this)

{
  Test *pTVar1;
  bool bVar2;
  LoadStatus LVar3;
  int iVar4;
  int iVar5;
  Node *pNVar6;
  Deps *pDVar7;
  vector<Node_*,_std::allocator<Node_*>_> *pvVar8;
  size_type sVar9;
  size_type sVar10;
  const_reference ppNVar11;
  string *psVar12;
  StringPiece local_438;
  Deps *local_428;
  Deps *log_deps;
  Node *node2;
  Node *node1;
  int i;
  undefined1 local_3e8 [8];
  DepsLog log2;
  State state2;
  Deps *log_deps_1;
  StringPiece local_258;
  Node *local_248;
  StringPiece local_240;
  Node *local_230;
  StringPiece local_228;
  StringPiece local_218;
  Node *local_208;
  StringPiece local_200;
  Node *local_1f0;
  undefined1 local_1e8 [8];
  vector<Node_*,_std::allocator<Node_*>_> deps;
  string local_1c8;
  undefined1 local_1a8 [8];
  string err;
  undefined1 local_178 [8];
  DepsLog log1;
  State state1;
  DepsLogTestWriteRead *this_local;
  
  State::State((State *)&log1.deps_.
                         super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
  DepsLog::DepsLog((DepsLog *)local_178);
  std::__cxx11::string::string((string *)local_1a8);
  pTVar1 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"DepsLogTest-tempfile",
             (allocator<char> *)
             ((long)&deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  bVar2 = DepsLog::OpenForWrite((DepsLog *)local_178,&local_1c8,(string *)local_1a8);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
             ,0x2e,"log1.OpenForWrite(kTestFilename, &err)");
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  pTVar1 = g_current_test;
  bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1a8);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                     ,0x2f,"\"\" == err");
  if (bVar2) {
    std::vector<Node_*,_std::allocator<Node_*>_>::vector
              ((vector<Node_*,_std::allocator<Node_*>_> *)local_1e8);
    StringPiece::StringPiece(&local_200,"foo.h");
    local_1f0 = State::GetNode((State *)&log1.deps_.
                                         super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               local_200,0);
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back
              ((vector<Node_*,_std::allocator<Node_*>_> *)local_1e8,&local_1f0);
    StringPiece::StringPiece(&local_218,"bar.h");
    local_208 = State::GetNode((State *)&log1.deps_.
                                         super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               local_218,0);
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back
              ((vector<Node_*,_std::allocator<Node_*>_> *)local_1e8,&local_208);
    StringPiece::StringPiece(&local_228,"out.o");
    pNVar6 = State::GetNode((State *)&log1.deps_.
                                      super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,local_228,0
                           );
    DepsLog::RecordDeps((DepsLog *)local_178,pNVar6,1,
                        (vector<Node_*,_std::allocator<Node_*>_> *)local_1e8);
    std::vector<Node_*,_std::allocator<Node_*>_>::clear
              ((vector<Node_*,_std::allocator<Node_*>_> *)local_1e8);
    StringPiece::StringPiece(&local_240,"foo.h");
    local_230 = State::GetNode((State *)&log1.deps_.
                                         super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               local_240,0);
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back
              ((vector<Node_*,_std::allocator<Node_*>_> *)local_1e8,&local_230);
    StringPiece::StringPiece(&local_258,"bar2.h");
    local_248 = State::GetNode((State *)&log1.deps_.
                                         super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               local_258,0);
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back
              ((vector<Node_*,_std::allocator<Node_*>_> *)local_1e8,&local_248);
    StringPiece::StringPiece((StringPiece *)&log_deps_1,"out2.o");
    pNVar6 = State::GetNode((State *)&log1.deps_.
                                      super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,_log_deps_1
                            ,0);
    DepsLog::RecordDeps((DepsLog *)local_178,pNVar6,2,
                        (vector<Node_*,_std::allocator<Node_*>_> *)local_1e8);
    StringPiece::StringPiece
              ((StringPiece *)
               &state2.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,"out.o");
    pNVar6 = State::GetNode((State *)&log1.deps_.
                                      super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            stack0xfffffffffffffd80,0);
    pDVar7 = DepsLog::GetDeps((DepsLog *)local_178,pNVar6);
    bVar2 = testing::Test::Check
                      (g_current_test,pDVar7 != (Deps *)0x0,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                       ,0x3d,"log_deps");
    if (bVar2) {
      bVar2 = testing::Test::Check
                        (g_current_test,pDVar7->mtime == 1,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                         ,0x3e,"1 == log_deps->mtime");
      if (bVar2) {
        bVar2 = testing::Test::Check
                          (g_current_test,pDVar7->node_count == 2,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                           ,0x3f,"2 == log_deps->node_count");
        pTVar1 = g_current_test;
        if (bVar2) {
          psVar12 = Node::path_abi_cxx11_(*pDVar7->nodes);
          bVar2 = std::operator==("foo.h",psVar12);
          bVar2 = testing::Test::Check
                            (pTVar1,bVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                             ,0x40,"\"foo.h\" == log_deps->nodes[0]->path()");
          pTVar1 = g_current_test;
          if (bVar2) {
            psVar12 = Node::path_abi_cxx11_(pDVar7->nodes[1]);
            bVar2 = std::operator==("bar.h",psVar12);
            bVar2 = testing::Test::Check
                              (pTVar1,bVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                               ,0x41,"\"bar.h\" == log_deps->nodes[1]->path()");
            if (bVar2) {
              deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
            }
            else {
              testing::Test::AddAssertionFailure(g_current_test);
              deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
            }
          }
          else {
            testing::Test::AddAssertionFailure(g_current_test);
            deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage._0_4_ = 1;
          }
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
          deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._0_4_ = 1;
        }
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
        deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ = 1;
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
      deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = 1;
    }
    std::vector<Node_*,_std::allocator<Node_*>_>::~vector
              ((vector<Node_*,_std::allocator<Node_*>_> *)local_1e8);
    if ((int)deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage == 0) {
      DepsLog::Close((DepsLog *)local_178);
      State::State((State *)&log2.deps_.
                             super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
      DepsLog::DepsLog((DepsLog *)local_3e8);
      pTVar1 = g_current_test;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&i,"DepsLogTest-tempfile",(allocator<char> *)((long)&node1 + 7));
      LVar3 = DepsLog::Load((DepsLog *)local_3e8,(string *)&i,
                            (State *)&log2.deps_.
                                      super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (string *)local_1a8);
      testing::Test::Check
                (pTVar1,LVar3 != LOAD_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                 ,0x48,"log2.Load(kTestFilename, &state2, &err)");
      std::__cxx11::string::~string((string *)&i);
      std::allocator<char>::~allocator((allocator<char> *)((long)&node1 + 7));
      pTVar1 = g_current_test;
      bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1a8);
      bVar2 = testing::Test::Check
                        (pTVar1,bVar2,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                         ,0x49,"\"\" == err");
      pTVar1 = g_current_test;
      if (bVar2) {
        pvVar8 = DepsLog::nodes((DepsLog *)local_178);
        sVar9 = std::vector<Node_*,_std::allocator<Node_*>_>::size(pvVar8);
        pvVar8 = DepsLog::nodes((DepsLog *)local_3e8);
        sVar10 = std::vector<Node_*,_std::allocator<Node_*>_>::size(pvVar8);
        bVar2 = testing::Test::Check
                          (pTVar1,sVar9 == sVar10,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                           ,0x4b,"log1.nodes().size() == log2.nodes().size()");
        if (bVar2) {
          node1._0_4_ = 0;
          while( true ) {
            iVar5 = (int)node1;
            pvVar8 = DepsLog::nodes((DepsLog *)local_178);
            sVar9 = std::vector<Node_*,_std::allocator<Node_*>_>::size(pvVar8);
            if ((int)sVar9 <= iVar5) break;
            pvVar8 = DepsLog::nodes((DepsLog *)local_178);
            ppNVar11 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                                 (pvVar8,(long)(int)node1);
            node2 = *ppNVar11;
            pvVar8 = DepsLog::nodes((DepsLog *)local_3e8);
            ppNVar11 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                                 (pvVar8,(long)(int)node1);
            iVar5 = (int)node1;
            pTVar1 = g_current_test;
            log_deps = (Deps *)*ppNVar11;
            iVar4 = Node::id(node2);
            bVar2 = testing::Test::Check
                              (pTVar1,iVar5 == iVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                               ,0x4f,"i == node1->id()");
            pTVar1 = g_current_test;
            if (!bVar2) {
              testing::Test::AddAssertionFailure(g_current_test);
              deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
              goto LAB_0019a777;
            }
            iVar5 = Node::id(node2);
            iVar4 = Node::id((Node *)log_deps);
            bVar2 = testing::Test::Check
                              (pTVar1,iVar5 == iVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                               ,0x50,"node1->id() == node2->id()");
            if (!bVar2) {
              testing::Test::AddAssertionFailure(g_current_test);
              deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
              goto LAB_0019a777;
            }
            node1._0_4_ = (int)node1 + 1;
          }
          StringPiece::StringPiece(&local_438,"out2.o");
          pNVar6 = State::GetNode((State *)&log2.deps_.
                                            super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  local_438,0);
          local_428 = DepsLog::GetDeps((DepsLog *)local_3e8,pNVar6);
          bVar2 = testing::Test::Check
                            (g_current_test,local_428 != (Deps *)0x0,
                             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                             ,0x55,"log_deps");
          if (bVar2) {
            bVar2 = testing::Test::Check
                              (g_current_test,local_428->mtime == 2,
                               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                               ,0x56,"2 == log_deps->mtime");
            if (bVar2) {
              bVar2 = testing::Test::Check
                                (g_current_test,local_428->node_count == 2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                                 ,0x57,"2 == log_deps->node_count");
              pTVar1 = g_current_test;
              if (bVar2) {
                psVar12 = Node::path_abi_cxx11_(*local_428->nodes);
                bVar2 = std::operator==("foo.h",psVar12);
                bVar2 = testing::Test::Check
                                  (pTVar1,bVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                                   ,0x58,"\"foo.h\" == log_deps->nodes[0]->path()");
                pTVar1 = g_current_test;
                if (bVar2) {
                  psVar12 = Node::path_abi_cxx11_(local_428->nodes[1]);
                  bVar2 = std::operator==("bar2.h",psVar12);
                  bVar2 = testing::Test::Check
                                    (pTVar1,bVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                                     ,0x59,"\"bar2.h\" == log_deps->nodes[1]->path()");
                  if (bVar2) {
                    deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                  }
                  else {
                    testing::Test::AddAssertionFailure(g_current_test);
                    deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
                  }
                }
                else {
                  testing::Test::AddAssertionFailure(g_current_test);
                  deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
                }
              }
              else {
                testing::Test::AddAssertionFailure(g_current_test);
                deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
              }
            }
            else {
              testing::Test::AddAssertionFailure(g_current_test);
              deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
            }
          }
          else {
            testing::Test::AddAssertionFailure(g_current_test);
            deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage._0_4_ = 1;
          }
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
          deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._0_4_ = 1;
        }
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
        deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ = 1;
      }
LAB_0019a777:
      DepsLog::~DepsLog((DepsLog *)local_3e8);
      State::~State((State *)&log2.deps_.
                              super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
    deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_1a8);
  DepsLog::~DepsLog((DepsLog *)local_178);
  State::~State((State *)&log1.deps_.
                          super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST_F(DepsLogTest, WriteRead) {
  State state1;
  DepsLog log1;
  string err;
  EXPECT_TRUE(log1.OpenForWrite(kTestFilename, &err));
  ASSERT_EQ("", err);

  {
    vector<Node*> deps;
    deps.push_back(state1.GetNode("foo.h", 0));
    deps.push_back(state1.GetNode("bar.h", 0));
    log1.RecordDeps(state1.GetNode("out.o", 0), 1, deps);

    deps.clear();
    deps.push_back(state1.GetNode("foo.h", 0));
    deps.push_back(state1.GetNode("bar2.h", 0));
    log1.RecordDeps(state1.GetNode("out2.o", 0), 2, deps);

    DepsLog::Deps* log_deps = log1.GetDeps(state1.GetNode("out.o", 0));
    ASSERT_TRUE(log_deps);
    ASSERT_EQ(1, log_deps->mtime);
    ASSERT_EQ(2, log_deps->node_count);
    ASSERT_EQ("foo.h", log_deps->nodes[0]->path());
    ASSERT_EQ("bar.h", log_deps->nodes[1]->path());
  }

  log1.Close();

  State state2;
  DepsLog log2;
  EXPECT_TRUE(log2.Load(kTestFilename, &state2, &err));
  ASSERT_EQ("", err);

  ASSERT_EQ(log1.nodes().size(), log2.nodes().size());
  for (int i = 0; i < (int)log1.nodes().size(); ++i) {
    Node* node1 = log1.nodes()[i];
    Node* node2 = log2.nodes()[i];
    ASSERT_EQ(i, node1->id());
    ASSERT_EQ(node1->id(), node2->id());
  }

  // Spot-check the entries in log2.
  DepsLog::Deps* log_deps = log2.GetDeps(state2.GetNode("out2.o", 0));
  ASSERT_TRUE(log_deps);
  ASSERT_EQ(2, log_deps->mtime);
  ASSERT_EQ(2, log_deps->node_count);
  ASSERT_EQ("foo.h", log_deps->nodes[0]->path());
  ASSERT_EQ("bar2.h", log_deps->nodes[1]->path());
}